

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

char * make4(uint v)

{
  make4::buf[0] = (byte)(v >> 0x12) | 0xf0;
  make4::buf[1] = (byte)(v >> 0xc) & 0x3f | 0x80;
  make4::buf[2] = (byte)(v >> 6) & 0x3f | 0x80;
  make4::buf[3] = (byte)v & 0x3f | 0x80;
  return (char *)make4::buf;
}

Assistant:

char *make4(unsigned v)
{
    static unsigned char buf[5] = {0};
    buf[0] = 0xF0 | ((v >> 18) ) ;
    buf[1] = 0x80 | ((v >> 12) & 0x3F );
    buf[2] = 0x80 | ((v >>  6) & 0x3F );
    buf[3] = 0x80 | ((v >>  0) & 0x3F );
    return reinterpret_cast<char*>(buf);
}